

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

value * __thiscall
mjs::interpreter::impl::operator()
          (value *__return_storage_ptr__,impl *this,identifier_expression *e)

{
  scope *this_00;
  wstring *id;
  reference local_40;
  identifier_expression *local_20;
  identifier_expression *e_local;
  impl *this_local;
  
  local_20 = e;
  e_local = (identifier_expression *)this;
  this_local = (impl *)__return_storage_ptr__;
  this_00 = gc_heap_ptr<mjs::interpreter::impl::scope>::operator->(&this->active_scope_);
  id = identifier_expression::id_abi_cxx11_(local_20);
  scope::lookup(&local_40,this_00,id);
  value::value(__return_storage_ptr__,&local_40);
  reference::~reference(&local_40);
  return __return_storage_ptr__;
}

Assistant:

value operator()(const identifier_expression& e) {
        // §10.1.4
        return value{active_scope_->lookup(e.id())};
    }